

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

int alsa_voice_is_ready(ALSA_VOICE *alsa_voice)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  long in_RDI;
  int err;
  unsigned_short revents;
  undefined4 uVar4;
  undefined2 in_stack_ffffffffffffffec;
  ushort in_stack_ffffffffffffffee;
  uint local_4;
  
  poll(*(pollfd **)(in_RDI + 0x18),(long)*(int *)(in_RDI + 0x20),0);
  snd_pcm_poll_descriptors_revents
            (*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x18),
             *(undefined4 *)(in_RDI + 0x20),&stack0xffffffffffffffee);
  if ((in_stack_ffffffffffffffee & 8) != 0) {
    iVar1 = snd_pcm_state(*(undefined8 *)(in_RDI + 0x30));
    if ((iVar1 != 4) && (iVar1 = snd_pcm_state(*(undefined8 *)(in_RDI + 0x30)), iVar1 != 7)) {
      uVar2 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x10a,"alsa_voice_is_ready");
      if ((uVar2 & 1) != 0) {
        _al_trace_suffix("Wait for poll failed\n");
      }
      return -8;
    }
    iVar1 = snd_pcm_state(*(undefined8 *)(in_RDI + 0x30));
    if (iVar1 == 4) {
      uVar4 = 0xffffffe0;
    }
    else {
      uVar4 = 0xffffffaa;
    }
    iVar1 = xrun_recovery((snd_pcm_t *)
                          CONCAT26(in_stack_ffffffffffffffee,
                                   CONCAT24(in_stack_ffffffffffffffec,uVar4)),0);
    if (iVar1 < 0) {
      uVar2 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x106,"alsa_voice_is_ready");
      if ((uVar2 & 1) != 0) {
        uVar3 = snd_strerror(uVar4);
        _al_trace_suffix("Write error: %s\n",uVar3);
      }
      return -8;
    }
  }
  local_4 = (uint)((in_stack_ffffffffffffffee & 4) != 0);
  return local_4;
}

Assistant:

static int alsa_voice_is_ready(ALSA_VOICE *alsa_voice)
{
   unsigned short revents;
   int err;

   poll(alsa_voice->ufds, alsa_voice->ufds_count, 0);
   snd_pcm_poll_descriptors_revents(alsa_voice->pcm_handle, alsa_voice->ufds,
                                    alsa_voice->ufds_count, &revents);

   if (revents & POLLERR) {
      if (snd_pcm_state(alsa_voice->pcm_handle) == SND_PCM_STATE_XRUN ||
          snd_pcm_state(alsa_voice->pcm_handle) == SND_PCM_STATE_SUSPENDED) {

         if (snd_pcm_state(alsa_voice->pcm_handle) == SND_PCM_STATE_XRUN)
            err = -EPIPE;
         else
            err = -ESTRPIPE;

         if (xrun_recovery(alsa_voice->pcm_handle, err) < 0) {
            ALLEGRO_ERROR("Write error: %s\n", snd_strerror(err));
            return -POLLERR;
         }
      } else {
         ALLEGRO_ERROR("Wait for poll failed\n");
         return -POLLERR;
      }
   }

   if (revents & POLLOUT)
      return true;

   return false;
}